

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O0

JsErrorCode JsCloneObject(JsValueRef source,JsValueRef *newObject)

{
  anon_class_16_2_9c3e6f4f fn;
  JsValueRef *local_20;
  JsValueRef *newObject_local;
  JsValueRef source_local;
  
  if (source == (JsValueRef)0x0) {
    source_local._4_4_ = JsErrorInvalidArgument;
  }
  else {
    fn.newObject = &local_20;
    fn.source = &newObject_local;
    local_20 = newObject;
    newObject_local = (JsValueRef *)source;
    source_local._4_4_ = ContextAPINoScriptWrapper<JsCloneObject::__0>(fn,false,false);
  }
  return source_local._4_4_;
}

Assistant:

CHAKRA_API JsCloneObject(_In_ JsValueRef source, _Out_ JsValueRef* newObject)
{
    VALIDATE_JSREF(source);

    return ContextAPINoScriptWrapper([&](Js::ScriptContext* scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {

        while (Js::VarIs<Js::JavascriptProxy>(source))
        {
            source = Js::UnsafeVarTo<Js::JavascriptProxy>(source)->GetTarget();
        }

        // We can currently only clone certain types of dynamic objects
        // TODO: support other object types
        if (Js::DynamicObject::IsBaseDynamicObject(source) ||
            Js::VarIs<JsrtExternalObject>(source) ||
            Js::VarIs<Js::CustomExternalWrapperObject>(source))
        {
            Js::DynamicObject* objSource = Js::UnsafeVarTo<Js::DynamicObject>(source);
            *newObject = objSource->Copy(true);
            return JsNoError;
        }

        return JsErrorInvalidArgument;
    });
}